

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
Parser::printError<unsigned_long,unsigned_long>
          (Parser *this,Token *token,char *text,unsigned_long *args,unsigned_long *args_1)

{
  string sStack_38;
  
  tinyformat::format<unsigned_long,unsigned_long>
            (&sStack_38,(tinyformat *)text,(char *)args,args_1,args_1);
  printError(this,token,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}